

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joystickmenu.cpp
# Opt level: O3

FOptionMenuDescriptor * UpdateJoystickConfigMenu(IJoystickConfig *joy)

{
  TDeletingArray<FOptionMenuItem_*,_FOptionMenuItem_*> *this;
  uint uVar1;
  FOptionMenuDescriptor *this_00;
  long *plVar2;
  int iVar3;
  long *plVar4;
  FOptionMenuItem *pFVar5;
  FOptionMenuItemOptionBase *pFVar6;
  undefined4 extraout_var;
  int iVar7;
  ulong uVar8;
  FString local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  plVar2 = (long *)((long)&(MenuDescriptors.Nodes)->Next +
                   (ulong)((MenuDescriptors.Size - 1 & 0x201) * 0x18));
  do {
    plVar4 = plVar2;
    if (plVar4 == (long *)0x0) {
      return (FOptionMenuDescriptor *)0x0;
    }
    if ((long *)*plVar4 == (long *)0x1) {
      return (FOptionMenuDescriptor *)0x0;
    }
    plVar2 = (long *)*plVar4;
  } while ((int)plVar4[1] != 0x201);
  this_00 = (FOptionMenuDescriptor *)plVar4[2];
  if ((this_00->super_FMenuDescriptor).mType != 1) {
    return (FOptionMenuDescriptor *)0x0;
  }
  this = &this_00->mItems;
  if (((this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count != 0) &&
     ((pFVar5 = *(this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>).Array,
      pFVar5 == (FOptionMenuItem *)0x0 ||
      ((*(pFVar5->super_FListMenuItem)._vptr_FListMenuItem[1])(),
      (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count != 0)))) {
    (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = 0;
  }
  if (joy == (IJoystickConfig *)0x0) {
    FString::operator=(&this_00->mTitle,"Configure Controller");
    pFVar5 = (FOptionMenuItem *)operator_new(0x28);
    local_60.Chars._0_4_ = 0;
    FOptionMenuItem::FOptionMenuItem
              (pFVar5,"Invalid controller specified for menu",(FName *)&local_60,true);
  }
  else {
    (*joy->_vptr_IJoystickConfig[2])(&local_60,joy);
    FString::Format(&this_00->mTitle,"Configure %s",
                    CONCAT44(local_60.Chars._4_4_,local_60.Chars._0_4_));
    FString::~FString(&local_60);
    SELECTED_JOYSTICK = joy;
    pFVar5 = (FOptionMenuItem *)operator_new(0x50);
    local_60.Chars._0_4_ = 0;
    FOptionMenuItem::FOptionMenuItem(pFVar5,"Overall sensitivity",(FName *)&local_60,false);
    *(undefined4 *)&pFVar5[1].super_FListMenuItem._vptr_FListMenuItem = 0;
    *(undefined4 *)((long)&pFVar5[1].super_FListMenuItem._vptr_FListMenuItem + 4) = 0;
    pFVar5[1].super_FListMenuItem.mXpos = 0;
    pFVar5[1].super_FListMenuItem.mYpos = 0x40000000;
    pFVar5[1].super_FListMenuItem.mAction = -0x66666666;
    pFVar5[1].super_FListMenuItem.mEnabled = true;
    *(undefined3 *)&pFVar5[1].super_FListMenuItem.field_0x15 = 0x3fb999;
    pFVar5[1].mLabel.Chars = (char *)0x3;
    *(undefined4 *)&pFVar5[1].mCentered = 0;
    (pFVar5->super_FListMenuItem)._vptr_FListMenuItem = (_func_int **)&PTR__FOptionMenuItem_00864978
    ;
    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
              (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
    uVar1 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
    (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1] = pFVar5;
    (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar1 + 1;
    pFVar5 = (FOptionMenuItem *)operator_new(0x28);
    local_60.Chars._0_4_ = 0;
    FOptionMenuItem::FOptionMenuItem(pFVar5," ",(FName *)&local_60,true);
    (pFVar5->super_FListMenuItem)._vptr_FListMenuItem = (_func_int **)&PTR__FOptionMenuItem_00864650
    ;
    *(EColorRange *)&pFVar5->field_0x24 = OptionSettings.mFontColor;
    TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
              (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
    uVar1 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
    (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1] = pFVar5;
    (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar1 + 1;
    iVar3 = (*joy->_vptr_IJoystickConfig[5])(joy);
    pFVar5 = (FOptionMenuItem *)operator_new(0x28);
    if (0 < iVar3) {
      local_60.Chars._0_4_ = 0;
      FOptionMenuItem::FOptionMenuItem(pFVar5,"Axis Configuration",(FName *)&local_60,true);
      (pFVar5->super_FListMenuItem)._vptr_FListMenuItem =
           (_func_int **)&PTR__FOptionMenuItem_00864650;
      *(EColorRange *)&pFVar5->field_0x24 = OptionSettings.mFontColorHeader;
      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
      uVar1 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
      (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1] = pFVar5;
      (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar1 + 1;
      iVar3 = (*joy->_vptr_IJoystickConfig[5])(joy);
      if (0 < iVar3) {
        uVar8 = 0;
        local_48 = 0;
        uStack_44 = 0;
        uStack_40 = 0;
        uStack_3c = 0x40100000;
        local_58 = 0;
        uStack_54 = 0;
        uStack_50 = 0xcccccccd;
        uStack_4c = 0x3feccccc;
        do {
          pFVar5 = (FOptionMenuItem *)operator_new(0x28);
          local_60.Chars._0_4_ = 0;
          FOptionMenuItem::FOptionMenuItem(pFVar5," ",(FName *)&local_60,true);
          (pFVar5->super_FListMenuItem)._vptr_FListMenuItem =
               (_func_int **)&PTR__FOptionMenuItem_00864650;
          *(EColorRange *)&pFVar5->field_0x24 = OptionSettings.mFontColor;
          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                    (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
          uVar1 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1] = pFVar5
          ;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar1 + 1;
          pFVar6 = (FOptionMenuItemOptionBase *)operator_new(0x38);
          iVar7 = (int)uVar8;
          iVar3 = (*joy->_vptr_IJoystickConfig[8])(joy,uVar8);
          FOptionMenuItemOptionBase::FOptionMenuItemOptionBase
                    (pFVar6,(char *)CONCAT44(extraout_var,iVar3),"none","JoyAxisMapNames",
                     (char *)0x0,0);
          (pFVar6->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem =
               (_func_int **)&PTR__FOptionMenuItem_00864a48;
          *(int *)&pFVar6->field_0x34 = iVar7;
          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                    (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
          uVar1 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1] =
               (FOptionMenuItem *)pFVar6;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar1 + 1;
          pFVar5 = (FOptionMenuItem *)operator_new(0x58);
          local_60.Chars._0_4_ = 0;
          FOptionMenuItem::FOptionMenuItem(pFVar5,"Overall sensitivity",(FName *)&local_60,false);
          pFVar5[1].super_FListMenuItem._vptr_FListMenuItem =
               (_func_int **)CONCAT44(uStack_44,local_48);
          pFVar5[1].super_FListMenuItem.mXpos = uStack_40;
          pFVar5[1].super_FListMenuItem.mYpos = uStack_3c;
          pFVar5[1].super_FListMenuItem.mAction = -0x66666666;
          pFVar5[1].super_FListMenuItem.mEnabled = true;
          *(undefined3 *)&pFVar5[1].super_FListMenuItem.field_0x15 = 0x3fb999;
          pFVar5[1].mLabel.Chars = (char *)0x3;
          *(undefined4 *)&pFVar5[1].mCentered = 0;
          (pFVar5->super_FListMenuItem)._vptr_FListMenuItem =
               (_func_int **)&PTR__FOptionMenuItem_00864be8;
          *(int *)&pFVar5[1].field_0x24 = iVar7;
          *(undefined4 *)&pFVar5[2].super_FListMenuItem._vptr_FListMenuItem = 1;
          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                    (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
          uVar1 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1] = pFVar5
          ;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar1 + 1;
          pFVar6 = (FOptionMenuItemOptionBase *)operator_new(0x38);
          FOptionMenuItemOptionBase::FOptionMenuItemOptionBase
                    (pFVar6,"Invert","none","YesNo",(char *)0x0,0);
          (pFVar6->super_FOptionMenuItem).super_FListMenuItem._vptr_FListMenuItem =
               (_func_int **)&PTR__FOptionMenuItem_00864cb8;
          *(int *)&pFVar6->field_0x34 = iVar7;
          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                    (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
          uVar1 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1] =
               (FOptionMenuItem *)pFVar6;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar1 + 1;
          pFVar5 = (FOptionMenuItem *)operator_new(0x58);
          local_60.Chars._0_4_ = 0;
          FOptionMenuItem::FOptionMenuItem(pFVar5,"Dead Zone",(FName *)&local_60,false);
          pFVar5[1].super_FListMenuItem._vptr_FListMenuItem =
               (_func_int **)CONCAT44(uStack_54,local_58);
          pFVar5[1].super_FListMenuItem.mXpos = uStack_50;
          pFVar5[1].super_FListMenuItem.mYpos = uStack_4c;
          pFVar5[1].super_FListMenuItem.mAction = -0x66666666;
          pFVar5[1].super_FListMenuItem.mEnabled = true;
          *(undefined3 *)&pFVar5[1].super_FListMenuItem.field_0x15 = 0x3fa999;
          pFVar5[1].mLabel.Chars = (char *)0x3;
          *(undefined4 *)&pFVar5[1].mCentered = 0;
          (pFVar5->super_FListMenuItem)._vptr_FListMenuItem =
               (_func_int **)&PTR__FOptionMenuItem_00864d88;
          *(int *)&pFVar5[1].field_0x24 = iVar7;
          *(undefined4 *)&pFVar5[2].super_FListMenuItem._vptr_FListMenuItem = 1;
          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
                    (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
          uVar1 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1] = pFVar5
          ;
          (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar1 + 1;
          uVar8 = (ulong)(iVar7 + 1U);
          iVar3 = (*joy->_vptr_IJoystickConfig[5])(joy);
        } while ((int)(iVar7 + 1U) < iVar3);
      }
      goto LAB_00332165;
    }
    local_60.Chars._0_4_ = 0;
    FOptionMenuItem::FOptionMenuItem(pFVar5,"No configurable axes",(FName *)&local_60,true);
  }
  (pFVar5->super_FListMenuItem)._vptr_FListMenuItem = (_func_int **)&PTR__FOptionMenuItem_00864650;
  *(EColorRange *)&pFVar5->field_0x24 = OptionSettings.mFontColor;
  TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Grow
            (&this->super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>,1);
  uVar1 = (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count;
  (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[uVar1] = pFVar5;
  (this_00->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count = uVar1 + 1;
LAB_00332165:
  this_00->mScrollPos = 0;
  this_00->mIndent = 0;
  this_00->mSelectedItem = -1;
  this_00->mPosition = -0x19;
  FOptionMenuDescriptor::CalcIndent(this_00);
  return this_00;
}

Assistant:

FOptionMenuDescriptor *UpdateJoystickConfigMenu(IJoystickConfig *joy)
{
	FMenuDescriptor **desc = MenuDescriptors.CheckKey(NAME_JoystickConfigMenu);
	if (desc != NULL && (*desc)->mType == MDESC_OptionsMenu)
	{
		FOptionMenuDescriptor *opt = (FOptionMenuDescriptor *)*desc;
		FOptionMenuItem *it;
		for(unsigned i=0;i<opt->mItems.Size();i++)
		{
			delete opt->mItems[i];
			opt->mItems.Clear();
		}
		if (joy == NULL)
		{
			opt->mTitle = "Configure Controller";
			it = new FOptionMenuItemStaticText("Invalid controller specified for menu", false);
			opt->mItems.Push(it);
		}
		else
		{
			opt->mTitle.Format("Configure %s", joy->GetName().GetChars());

			SELECTED_JOYSTICK = joy;

			it = new FOptionMenuSliderJoySensitivity("Overall sensitivity", 0, 2, 0.1, 3);
			opt->mItems.Push(it);
			it = new FOptionMenuItemStaticText(" ", false);
			opt->mItems.Push(it);

			if (joy->GetNumAxes() > 0)
			{
				it = new FOptionMenuItemStaticText("Axis Configuration", true);
				opt->mItems.Push(it);

				for (int i = 0; i < joy->GetNumAxes(); ++i)
				{
					it = new FOptionMenuItemStaticText(" ", false);
					opt->mItems.Push(it);

					it = new FOptionMenuItemJoyMap(joy->GetAxisName(i), i, "JoyAxisMapNames", false);
					opt->mItems.Push(it);
					it = new FOptionMenuSliderJoyScale("Overall sensitivity", i, 0, 4, 0.1, 3);
					opt->mItems.Push(it);
					it = new FOptionMenuItemInverter("Invert", i, false);
					opt->mItems.Push(it);
					it = new FOptionMenuSliderJoyDeadZone("Dead Zone", i, 0, 0.9, 0.05, 3);
					opt->mItems.Push(it);
				}
			}
			else
			{
				it = new FOptionMenuItemStaticText("No configurable axes", false);
				opt->mItems.Push(it);
			}
		}
		opt->mScrollPos = 0;
		opt->mSelectedItem = -1;
		opt->mIndent = 0;
		opt->mPosition = -25;
		opt->CalcIndent();
		return opt;
	}
	return NULL;
}